

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

void If_CluHashPrintStats(If_Man_t *p,int t)

{
  void **ppvVar1;
  uint uVar2;
  ulong uVar3;
  
  if (0 < p->nTableSize[t]) {
    uVar3 = 0;
    do {
      ppvVar1 = p->pHashTable[t] + uVar3;
      uVar2 = 0xffffffff;
      do {
        ppvVar1 = (void **)*ppvVar1;
        uVar2 = uVar2 + 1;
      } while (ppvVar1 != (void **)0x0);
      if (9 < uVar2) {
        printf("%d=%d ",uVar3 & 0xffffffff);
      }
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)p->nTableSize[t]);
  }
  return;
}

Assistant:

void If_CluHashPrintStats( If_Man_t * p, int t )
{
    If_Hte_t * pEntry;
    int i, Counter;
    for ( i = 0; i < p->nTableSize[t]; i++ )
    {
        Counter = 0;
        for ( pEntry = ((If_Hte_t **)p->pHashTable[t])[i]; pEntry; pEntry = pEntry->pNext )
            Counter++;
        if ( Counter == 0 )
            continue;
        if ( Counter < 10 )
            continue;
        printf( "%d=%d ", i, Counter );
    }
}